

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O3

void __thiscall
cs_impl::runtime_cs_ext::fiber_callable::fiber_callable
          (fiber_callable *this,function *fn,vector *data,array *append_args)

{
  pointer paVar1;
  _Elt_pointer local_58;
  _Elt_pointer paStack_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  _Elt_pointer local_38;
  _Elt_pointer paStack_30;
  _Elt_pointer local_28;
  _Map_pointer ppaStack_20;
  
  this->context = &fn->mContext;
  this->func = fn;
  paVar1 = (data->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  (this->args).super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
  super__Vector_impl_data._M_start =
       (data->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
       super__Vector_impl_data._M_start;
  (this->args).super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
  super__Vector_impl_data._M_finish = paVar1;
  (this->args).super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (data->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (data->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (data->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (data->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = (append_args->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
             super__Deque_impl_data._M_start._M_cur;
  paStack_30 = (append_args->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl
               .super__Deque_impl_data._M_start._M_first;
  local_28 = (append_args->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
             super__Deque_impl_data._M_start._M_last;
  ppaStack_20 = (append_args->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                _M_impl.super__Deque_impl_data._M_start._M_node;
  local_58 = (append_args->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
  paStack_50 = (append_args->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl
               .super__Deque_impl_data._M_finish._M_first;
  local_48 = *(undefined4 *)
              &(append_args->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl
               .super__Deque_impl_data._M_finish._M_last;
  uStack_44 = *(undefined4 *)
               ((long)&(append_args->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)
                       ._M_impl.super__Deque_impl_data._M_finish._M_last + 4);
  uStack_40 = *(undefined4 *)
               &(append_args->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                _M_impl.super__Deque_impl_data._M_finish._M_node;
  uStack_3c = *(undefined4 *)
               ((long)&(append_args->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)
                       ._M_impl.super__Deque_impl_data._M_finish._M_node + 4);
  std::vector<cs_impl::any,std::allocator<cs_impl::any>>::
  _M_range_insert<std::_Deque_iterator<cs_impl::any,cs_impl::any_const&,cs_impl::any_const*>>
            ((vector<cs_impl::any,std::allocator<cs_impl::any>> *)&this->args,
             (this->args).super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
             super__Vector_impl_data._M_finish,&local_38,&local_58);
  return;
}

Assistant:

fiber_callable(function const *fn, vector data, const array &append_args) : context(fn->get_context()), func(fn), args(std::move(data))
			{
				args.insert(args.end(), append_args.begin(), append_args.end());
			}